

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CPhase<std::complex<float>_>::CPhase(CPhase<std::complex<float>_> *this)

{
  Phase<std::complex<float>_> *this_00;
  
  (this->super_QControlledGate2<std::complex<float>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<float>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004ef260;
  this_00 = (Phase<std::complex<float>_> *)operator_new(0x18);
  Phase<std::complex<float>_>::Phase(this_00,1,0.0,false);
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<float>_>,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_false>._M_head_impl = this_00
  ;
  return;
}

Assistant:

CPhase()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< Phase< T > >( 1 , 0. ) )
        { }